

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

bool __thiscall
pybind11::detail::object_api<pybind11::handle>::contains<char_const*&>
          (object_api<pybind11::handle> *this,char **key)

{
  bool bVar1;
  str_attr_accessor local_40;
  object local_20;
  char **local_18;
  char **key_local;
  object_api<pybind11::handle> *this_local;
  
  local_18 = key;
  key_local = (char **)this;
  attr(&local_40,this,"__contains__");
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
            ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              *)&local_20,(char **)&local_40);
  bVar1 = object::cast<bool>(&local_20);
  object::~object(&local_20);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_40);
  return bVar1;
}

Assistant:

bool object_api<D>::contains(T &&key) const {
    return attr("__contains__")(std::forward<T>(key)).template cast<bool>();
}